

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGenericHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestGenericHandler::StartLogFile
          (cmCTestGenericHandler *this,char *name,cmGeneratedFileStream *xofs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCTest *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  size_t sVar5;
  mapped_type *this_00;
  ostream *poVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  ostringstream cmCTestLog_msg_1;
  ostringstream ostr;
  string local_380;
  long *local_360 [2];
  long local_350 [2];
  string local_340;
  undefined1 local_320 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  char *local_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  long *local_2e8;
  long **local_2e0;
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  if (name == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Cannot create log file without providing the name",0x31);
    std::ios::widen((char)(ostringstream *)local_1a8 +
                    (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                 ,0x9c,(char *)local_320._0_8_,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._0_8_ != &local_310) {
      operator_delete((void *)local_320._0_8_,local_310._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    bVar4 = false;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Last",4);
    sVar5 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,name,sVar5);
    if (0 < this->SubmitIndex) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      std::ostream::operator<<(local_1a8,this->SubmitIndex);
    }
    cmCTest::GetCurrentTag_abi_cxx11_((string *)local_320,this->CTest);
    uVar3 = local_320._8_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._0_8_ != &local_310) {
      operator_delete((void *)local_320._0_8_,local_310._M_allocated_capacity + 1);
    }
    if ((char *)uVar3 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      cmCTest::GetCurrentTag_abi_cxx11_((string *)local_320,this->CTest);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_320._0_8_,local_320._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._0_8_ != &local_310) {
        operator_delete((void *)local_320._0_8_,local_310._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".log",4);
    cmCTest::GetBinaryDir_abi_cxx11_(&local_340,this->CTest);
    std::__cxx11::stringbuf::str();
    local_320._0_8_ = local_340._M_string_length;
    local_320._8_8_ = local_340._M_dataplus._M_p;
    local_310._8_8_ = 0x13;
    local_300 = "/Testing/Temporary/";
    local_2f8 = 0;
    local_2f0 = local_360[1];
    local_2e8 = local_360[0];
    views._M_len = 3;
    views._M_array = (iterator)local_320;
    local_310._M_allocated_capacity = (size_type)&local_340;
    local_2e0 = local_360;
    cmCatViews(&local_380,views);
    local_320._0_8_ = &local_310;
    sVar5 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,name,name + sVar5);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->LogFileNames,(key_type *)local_320);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_380);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._0_8_ != &local_310) {
      operator_delete((void *)local_320._0_8_,(ulong)(local_310._M_allocated_capacity + 1));
    }
    paVar1 = &local_380.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if (local_360[0] != local_350) {
      operator_delete(local_360[0],local_350[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    pcVar2 = this->CTest;
    local_320._0_8_ = &local_310;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Temporary","");
    std::__cxx11::stringbuf::str();
    bVar4 = cmCTest::OpenOutputFile(pcVar2,(string *)local_320,&local_380,xofs,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != paVar1) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._0_8_ != &local_310) {
      operator_delete((void *)local_320._0_8_,(ulong)(local_310._M_allocated_capacity + 1));
    }
    if (!bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"Cannot create log file: ",0x18);
      std::__cxx11::stringbuf::str();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_320,local_380._M_dataplus._M_p,local_380._M_string_length
                         );
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != paVar1) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      pcVar2 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestGenericHandler.cxx"
                   ,0xac,local_380._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_380._M_dataplus._M_p != paVar1) {
        operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
      std::ios_base::~ios_base(local_2b0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  return bVar4;
}

Assistant:

bool cmCTestGenericHandler::StartLogFile(const char* name,
                                         cmGeneratedFileStream& xofs)
{
  if (!name) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file without providing the name"
                 << std::endl);
    return false;
  }
  std::ostringstream ostr;
  ostr << "Last" << name;
  if (this->SubmitIndex > 0) {
    ostr << "_" << this->SubmitIndex;
  }
  if (!this->CTest->GetCurrentTag().empty()) {
    ostr << "_" << this->CTest->GetCurrentTag();
  }
  ostr << ".log";
  this->LogFileNames[name] =
    cmStrCat(this->CTest->GetBinaryDir(), "/Testing/Temporary/", ostr.str());
  if (!this->CTest->OpenOutputFile("Temporary", ostr.str(), xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create log file: " << ostr.str() << std::endl);
    return false;
  }
  return true;
}